

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O2

LPVOID VIRTUALReserveMemory
                 (CPalThread *pthrCurrent,LPVOID lpAddress,SIZE_T dwSize,DWORD flAllocationType,
                 DWORD flProtect)

{
  bool bVar1;
  byte bVar2;
  void *__addr;
  int *piVar3;
  PCMI pInformation;
  BYTE *pBVar4;
  BYTE *pvMem;
  _CMI *p_Var5;
  PCMI p_Var6;
  size_t szSize;
  PCMI p_Var7;
  void *__addr_00;
  size_t __len;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_0012f1ce;
  if ((flAllocationType >> 0x1e & 1) != 0) {
    fprintf(_stderr,"MEM_RESERVE_EXECUTABLE is not supported!");
    abort();
  }
  CorUnix::InternalEnterCriticalSection(pthrCurrent,&virtual_critsec);
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012f1ce;
  __addr_00 = (void *)((ulong)lpAddress & 0xffffffffffff0000);
  __len = ((long)lpAddress + dwSize + 0xfff & 0xfffffffffffff000) - (long)__addr_00;
  __addr = mmap64(__addr_00,__len,0,0x22,-1,0);
  if (((__addr == (void *)0xffffffffffffffff) || (__addr_00 == (void *)0x0)) ||
     (__addr == __addr_00)) {
    if (__addr == (void *)0xffffffffffffffff) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012f1ce;
      piVar3 = __errno_location();
      *piVar3 = 8;
    }
    else if (__addr != (void *)0x0) {
      if (lpAddress == (LPVOID)0x0) {
        __len = (dwSize + 0xfff + (long)__addr & 0xfffffffffffff000) -
                (long)((ulong)__addr & 0xfffffffffffff000);
        __addr_00 = (void *)((ulong)__addr & 0xfffffffffffff000);
      }
      pInformation = (PCMI)CorUnix::InternalMalloc(0x38);
      if (pInformation == (PCMI)0x0) {
        bVar1 = true;
        bVar2 = PAL_InitializeChakraCoreCalled;
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012f1ce;
      }
      else {
        pInformation->startBoundary = (UINT_PTR)__addr_00;
        pInformation->memSize = __len;
        pInformation->allocationType = flAllocationType;
        pInformation->accessProtection = flProtect;
        szSize = ((__len >> 0xf) + 1) - (ulong)((__len & 0x7000) == 0);
        pBVar4 = (BYTE *)CorUnix::InternalMalloc(szSize);
        pInformation->pAllocState = pBVar4;
        pvMem = (BYTE *)CorUnix::InternalMalloc(__len >> 0xc);
        pInformation->pProtectionState = pvMem;
        pBVar4 = pInformation->pAllocState;
        if (pvMem == (BYTE *)0x0 || pBVar4 == (BYTE *)0x0) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012f1ce;
          if (pvMem != (BYTE *)0x0) {
            CorUnix::InternalFree(pvMem);
            pBVar4 = pInformation->pAllocState;
          }
          pInformation->pProtectionState = (BYTE *)0x0;
          if (pBVar4 != (BYTE *)0x0) {
            CorUnix::InternalFree(pBVar4);
          }
          pInformation->pAllocState = (BYTE *)0x0;
          CorUnix::InternalFree(pInformation);
          bVar1 = true;
          bVar2 = PAL_InitializeChakraCoreCalled;
        }
        else {
          VIRTUALSetAllocState(0x2000,0,szSize * 8,pInformation);
          pBVar4 = pInformation->pProtectionState;
          bVar2 = VIRTUALConvertWinFlags(flProtect);
          memset(pBVar4,(uint)bVar2,__len >> 0xc);
          bVar2 = PAL_InitializeChakraCoreCalled;
          if (pVirtualMemory == (PCMI)0x0) {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012f1ce;
            p_Var7 = (_CMI *)0x0;
            pVirtualMemory = pInformation;
            p_Var6 = pInformation;
LAB_0012f150:
            p_Var6->pNext = (_CMI *)0x0;
            pVirtualMemory->pLast = p_Var7;
            pVirtualMemory = pInformation;
          }
          else {
            if (__addr_00 <= (void *)pVirtualMemory->startBoundary) {
              if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012f1ce;
              pInformation->pNext = pVirtualMemory;
              p_Var6 = (PCMI)&pInformation->pLast;
              p_Var7 = pInformation;
              goto LAB_0012f150;
            }
            p_Var5 = pVirtualMemory;
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012f1ce;
            do {
              p_Var6 = p_Var5;
              p_Var5 = p_Var6->pNext;
              if (p_Var5 == (_CMI *)0x0) {
                pInformation->pNext = (_CMI *)0x0;
                p_Var5 = pInformation;
                p_Var7 = p_Var6;
                goto LAB_0012f16c;
              }
            } while ((void *)p_Var5->startBoundary < __addr_00);
            pInformation->pNext = p_Var5;
            pInformation->pLast = p_Var6;
            p_Var7 = pInformation;
LAB_0012f16c:
            p_Var5->pLast = p_Var7;
            p_Var6->pNext = pInformation;
          }
          bVar1 = false;
        }
      }
      if ((bVar2 & 1) == 0) {
LAB_0012f1ce:
        abort();
      }
      if (!bVar1) goto LAB_0012f078;
      fprintf(_stderr,"] %s %s:%d","VIRTUALReserveMemory",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
              ,0x401);
      fprintf(_stderr,"Unable to store the structure in the list.\n");
      piVar3 = __errno_location();
      *piVar3 = 0x54f;
      goto LAB_0012ef3e;
    }
  }
  else {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012f1ce;
    piVar3 = __errno_location();
    *piVar3 = 0x1e7;
LAB_0012ef3e:
    munmap(__addr,__len);
  }
  __addr = (void *)0x0;
LAB_0012f078:
  CorUnix::InternalLeaveCriticalSection(pthrCurrent,&virtual_critsec);
  return __addr;
}

Assistant:

static LPVOID VIRTUALReserveMemory(
                IN CPalThread *pthrCurrent, /* Currently executing thread */
                IN LPVOID lpAddress,        /* Region to reserve or commit */
                IN SIZE_T dwSize,           /* Size of Region */
                IN DWORD flAllocationType,  /* Type of allocation */
                IN DWORD flProtect)         /* Type of access protection */
{
    LPVOID pRetVal      = NULL;
    UINT_PTR StartBoundary;
    SIZE_T MemSize;

    TRACE( "Reserving the memory now..\n");

    // First, figure out where we're trying to reserve the memory and
    // how much we need. On most systems, requests to mmap must be
    // page-aligned and at multiples of the page size.
    StartBoundary = (UINT_PTR)lpAddress & ~BOUNDARY_64K;
    /* Add the sizes, and round down to the nearest page boundary. */
    MemSize = ( ((UINT_PTR)lpAddress + dwSize + VIRTUAL_PAGE_MASK) & ~VIRTUAL_PAGE_MASK ) -
               StartBoundary;

    if ((flAllocationType & MEM_RESERVE_EXECUTABLE) != 0)
    {
        fprintf(stderr, "MEM_RESERVE_EXECUTABLE is not supported!");
        abort();
    }

    InternalEnterCriticalSection(pthrCurrent, &virtual_critsec);

    if (pRetVal == NULL)
    {
        // Try to reserve memory from the OS
        pRetVal = ReserveVirtualMemory(pthrCurrent, (LPVOID)StartBoundary, MemSize);
    }

    if (pRetVal != NULL)
    {
#if !MMAP_IGNORES_HINT
        if ( !lpAddress )
        {
#endif  // MMAP_IGNORES_HINT
            /* Compute the real values instead of the null values. */
            StartBoundary = (UINT_PTR)pRetVal & ~VIRTUAL_PAGE_MASK;

            MemSize = ( ((UINT_PTR)pRetVal + dwSize + VIRTUAL_PAGE_MASK) & ~VIRTUAL_PAGE_MASK ) -
                      StartBoundary;
#if !MMAP_IGNORES_HINT
        }
#endif  // MMAP_IGNORES_HINT
        if ( !VIRTUALStoreAllocationInfo( StartBoundary, MemSize,
                                   flAllocationType, flProtect ) )
        {
            ASSERT( "Unable to store the structure in the list.\n");
            pthrCurrent->SetLastError( ERROR_INTERNAL_ERROR );
            munmap( pRetVal, MemSize );
            pRetVal = NULL;
        }
    }

    InternalLeaveCriticalSection(pthrCurrent, &virtual_critsec);
    return pRetVal;
}